

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_symbolMacroValueBinding_create
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t name,
          sysbvm_tuple_t expansion)

{
  sysbvm_object_tuple_t *psVar1;
  anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 aVar2;
  ulong immediateTypeTag;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).symbolMacroValueBindingType,6);
  (psVar1->field_1).pointers[0] = name;
  psVar1[1].field_1.pointers[0] = sourcePosition;
  immediateTypeTag = expansion & 0xf;
  if (immediateTypeTag == 0 && expansion != 0) {
    aVar2.typePointer = *expansion;
  }
  else if ((int)immediateTypeTag == 0xf) {
    aVar2.typePointer = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,expansion >> 4);
  }
  else {
    aVar2.typePointer = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
  }
  psVar1[2].header.field_0 = aVar2;
  psVar1[2].header.identityHashAndFlags = (int)expansion;
  psVar1[2].header.objectSize = (int)(expansion >> 0x20);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_symbolMacroValueBinding_create(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t name, sysbvm_tuple_t expansion)
{
    sysbvm_symbolMacroValueBinding_t *result = (sysbvm_symbolMacroValueBinding_t*)sysbvm_context_allocatePointerTuple(context, context->roots.symbolMacroValueBindingType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_symbolMacroValueBinding_t));
    result->super.super.name = name;
    result->super.sourcePosition = sourcePosition;
    result->super.type = sysbvm_tuple_getType(context, expansion);
    result->expansion = expansion;
    return (sysbvm_tuple_t)result;
}